

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O3

bool QWindowSystemInterface::handleKeyEvent<QWindowSystemInterface::SynchronousDelivery>
               (QWindow *window,ulong timestamp,Type t,int k,KeyboardModifiers mods,QString *text,
               bool autorep,ushort count)

{
  long lVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  QString args_5;
  bool bVar4;
  long in_FS_OFFSET;
  QArrayData *pQVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = &((text->d).d)->super_QArrayData;
  pcVar3 = (text->d).ptr;
  if (pQVar2 == (QArrayData *)0x0) {
    pQVar5 = (QArrayData *)0x0;
  }
  else {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar5 = pQVar2;
  }
  args_5.d.ptr._0_2_ = count;
  args_5.d.d = (Data *)(ulong)autorep;
  args_5.d.ptr._2_6_ = 0;
  args_5.d.size = (qsizetype)pQVar5;
  bVar4 = QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
          handleEvent<QWindowSystemInterfacePrivate::KeyEvent,QWindow*,unsigned_long,QEvent::Type,int,QFlags<Qt::KeyboardModifier>,QString,bool,unsigned_short>
                    (window,timestamp,t,k,
                     (QFlags<Qt::KeyboardModifier>)
                     mods.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                     super_QFlagsStorage<Qt::KeyboardModifier>.i,args_5,true,(unsigned_short)pcVar3)
  ;
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar5,2,0x10);
    }
  }
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

QT_DEFINE_QPA_EVENT_HANDLER(bool, handleKeyEvent, QWindow *window, ulong timestamp, QEvent::Type t, int k, Qt::KeyboardModifiers mods, const QString & text, bool autorep, ushort count)
{
    return handleWindowSystemEvent<QWindowSystemInterfacePrivate::KeyEvent, Delivery>(window,
        timestamp, t, k, mods, text, autorep, count);
}